

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

int lyxml_print_mem(char **strp,lyxml_elem *elem,int options)

{
  int iVar1;
  lyout local_30;
  
  iVar1 = 0;
  if (elem != (lyxml_elem *)0x0 && strp != (char **)0x0) {
    local_30.type = LYOUT_MEMORY;
    local_30.method.f = (FILE *)0x0;
    local_30.method.mem.len = 0;
    local_30.method.mem.size = 0;
    if ((options & 0x10U) == 0) {
      iVar1 = dump_elem(&local_30,elem,0,options,1);
    }
    else {
      iVar1 = dump_siblings(&local_30,elem,options);
    }
    *strp = (char *)local_30.method.f;
  }
  return iVar1;
}

Assistant:

API int
lyxml_print_mem(char **strp, const struct lyxml_elem *elem, int options)
{
    struct lyout out;
    int r;

    if (!strp || !elem) {
        return 0;
    }

    out.type = LYOUT_MEMORY;
    out.method.mem.buf = NULL;
    out.method.mem.len = 0;
    out.method.mem.size = 0;

    if (options & LYXML_PRINT_SIBLINGS) {
        r = dump_siblings(&out, elem, options);
    } else {
        r = dump_elem(&out, elem, 0, options, 1);
    }

    *strp = out.method.mem.buf;
    return r;
}